

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O0

void Gs::Normalize<Gs::Vector<float,3ul>,float>
               (Vector<float,_3UL> *outVec,Vector<float,_3UL> *inVec)

{
  float fVar1;
  double dVar2;
  undefined8 local_28;
  float local_20;
  float local_1c;
  Vector<float,_3UL> *pVStack_18;
  float len;
  Vector<float,_3UL> *inVec_local;
  Vector<float,_3UL> *outVec_local;
  
  pVStack_18 = inVec;
  inVec_local = outVec;
  local_1c = LengthSq<Gs::Vector<float,3ul>,float>(inVec);
  if (((local_1c == 0.0) && (!NAN(local_1c))) || ((local_1c == 1.0 && (!NAN(local_1c))))) {
    fVar1 = pVStack_18->y;
    inVec_local->x = pVStack_18->x;
    inVec_local->y = fVar1;
    inVec_local->z = pVStack_18->z;
  }
  else {
    dVar2 = std::sqrt((double)(ulong)(uint)local_1c);
    local_1c = 1.0 / SUB84(dVar2,0);
    operator*((Gs *)&local_28,pVStack_18,&local_1c);
    inVec_local->x = (float)(undefined4)local_28;
    inVec_local->y = (float)local_28._4_4_;
    inVec_local->z = local_20;
  }
  return;
}

Assistant:

void Normalize(TVector& outVec, const TVector& inVec)
{
    TScalar len = LengthSq<TVector, TScalar>(inVec);
    if (len != TScalar(0) && len != TScalar(1))
    {
        len = TScalar(1) / std::sqrt(len);
        outVec = inVec * len;
    }
    else
        outVec = inVec;
}